

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapper::addMapping(QDataWidgetMapper *this,QWidget *widget,int section)

{
  int in_EDX;
  QDataWidgetMapperPrivate *in_RSI;
  WidgetMapper *in_RDI;
  long in_FS_OFFSET;
  QDataWidgetMapperPrivate *d;
  value_type *in_stack_ffffffffffffff58;
  QWidget *in_stack_ffffffffffffff78;
  QDataWidgetMapper *in_stack_ffffffffffffff80;
  undefined1 local_58 [48];
  QPersistentModelIndex local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDataWidgetMapper *)0x870e69);
  removeMapping(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QPointer<QWidget>::QPointer<void>(&in_RDI->widget,(QWidget *)in_stack_ffffffffffffff58);
  QDataWidgetMapperPrivate::indexAt(in_RSI,in_EDX);
  QPersistentModelIndex::QPersistentModelIndex(local_28,(QModelIndex *)local_58);
  QByteArray::QByteArray((QByteArray *)0x870eea);
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::push_back((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               *)in_RDI,in_stack_ffffffffffffff58);
  QDataWidgetMapperPrivate::WidgetMapper::~WidgetMapper(in_RDI);
  QObject::installEventFilter((QObject *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::addMapping(QWidget *widget, int section)
{
    Q_D(QDataWidgetMapper);

    removeMapping(widget);
    d->widgetMap.push_back({widget, section, d->indexAt(section), QByteArray()});
    widget->installEventFilter(d->delegate);
}